

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoDictionary.cpp
# Opt level: O0

PDFTextString * __thiscall
InfoDictionary::GetAdditionalInfoEntry
          (PDFTextString *__return_storage_ptr__,InfoDictionary *this,string *inKey)

{
  bool bVar1;
  PDFTextString *pPVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *inKey_local;
  InfoDictionary *this_local;
  
  it._M_node = (_Base_ptr)inKey;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>_>
       ::find(&this->mAdditionalInfoEntries,inKey);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>_>
       ::end(&this->mAdditionalInfoEntries);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    pPVar2 = PDFTextString::Empty();
    PDFTextString::PDFTextString(__return_storage_ptr__,pPVar2);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PDFTextString>_>
             ::operator->(&local_28);
    PDFTextString::PDFTextString(__return_storage_ptr__,&ppVar3->second);
  }
  return __return_storage_ptr__;
}

Assistant:

PDFTextString InfoDictionary::GetAdditionalInfoEntry(const std::string& inKey)
{
	StringToPDFTextString::iterator it = mAdditionalInfoEntries.find(inKey);

	if(it == mAdditionalInfoEntries.end())
		return PDFTextString::Empty();
	else
		return it->second;
}